

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alu.h
# Opt level: O0

enable_if_t<std::is_integral<unsigned_long>::value>
SetAmbiPanIdentity<(anonymous_namespace)::AutowahState::__0*,unsigned_long,(anonymous_namespace)::AutowahState::update(ALCcontext_const*,EffectSlot_const*,EffectProps_const*,EffectTarget)::__0>
          (anon_struct_136_3_13600e2c *iter,unsigned_long count,anon_class_24_2_544d122c func)

{
  span<const_float,_16UL> coeffs_00;
  span<const_float,_16UL> coeffs_01;
  reference pvVar1;
  anon_struct_136_3_13600e2c *in_RSI;
  array<float,_16UL> *in_RDI;
  unsigned_long i;
  array<float,_16UL> coeffs;
  size_type in_stack_ffffffffffffff78;
  float *in_stack_ffffffffffffff80;
  array<float,_16UL> *arr;
  span<const_float,_16UL> *this;
  anon_struct_136_3_13600e2c *in_stack_ffffffffffffffa0;
  anon_struct_136_3_13600e2c *chan;
  anon_class_24_2_544d122c *in_stack_ffffffffffffffa8;
  undefined4 uVar2;
  undefined4 in_stack_ffffffffffffffb4;
  float *local_8;
  
  this = (span<const_float,_16UL> *)&stack0x00000008;
  if (in_RSI != (anon_struct_136_3_13600e2c *)0x0) {
    memset(&stack0xffffffffffffffb0,0,0x40);
    uVar2 = 0x3f800000;
    arr = in_RDI;
    al::span<const_float,_16UL>::span(this,in_RDI);
    coeffs_00.mData._4_4_ = in_stack_ffffffffffffffb4;
    coeffs_00.mData._0_4_ = uVar2;
    (anonymous_namespace)::AutowahState::
    update(ALCcontext_const*,EffectSlot_const*,EffectProps_const*,EffectTarget)::$_0::operator()
              (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,coeffs_00);
    local_8 = in_RDI[2]._M_elems + 2;
    for (chan = (anon_struct_136_3_13600e2c *)0x1; chan < in_RSI;
        chan = (anon_struct_136_3_13600e2c *)((long)&(chan->Filter).z1 + 1)) {
      pvVar1 = std::array<float,_16UL>::operator[]
                         ((array<float,_16UL> *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78)
      ;
      *pvVar1 = 0.0;
      pvVar1 = std::array<float,_16UL>::operator[]
                         ((array<float,_16UL> *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78)
      ;
      *pvVar1 = 1.0;
      in_stack_ffffffffffffff80 = local_8;
      al::span<const_float,_16UL>::span(this,arr);
      coeffs_01.mData._4_4_ = in_stack_ffffffffffffffb4;
      coeffs_01.mData._0_4_ = uVar2;
      (anonymous_namespace)::AutowahState::
      update(ALCcontext_const*,EffectSlot_const*,EffectProps_const*,EffectTarget)::$_0::operator()
                (in_stack_ffffffffffffffa8,chan,coeffs_01);
      local_8 = local_8 + 0x22;
    }
  }
  return;
}

Assistant:

auto SetAmbiPanIdentity(T iter, I count, F func) -> std::enable_if_t<std::is_integral<I>::value>
{
    if(count < 1) return;

    std::array<float,MAX_AMBI_CHANNELS> coeffs{{1.0f}};
    func(*iter, coeffs);
    ++iter;
    for(I i{1};i < count;++i,++iter)
    {
        coeffs[i-1] = 0.0f;
        coeffs[i  ] = 1.0f;
        func(*iter, coeffs);
    }
}